

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O0

string * Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>(LbdMode *x,uint *y)

{
  string *psVar1;
  string *in_RDI;
  string res;
  LbdMode x_00;
  string *out;
  string local_38 [56];
  
  out = in_RDI;
  std::__cxx11::string::string(local_38);
  x_00 = (LbdMode)((ulong)in_RDI >> 0x20);
  psVar1 = Clasp::xconvert(out,x_00);
  std::__cxx11::string::append((ulong)psVar1,'\x01');
  psVar1 = xconvert(out,x_00);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  std::__cxx11::string::~string(local_38);
  return out;
}

Assistant:

inline std::string toString(const T& x, const U& y) {
	std::string res;
	xconvert(res, x).append(1, ',');
	return xconvert(res, y);
}